

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int imcomp_convert_tile_tfloat
              (fitsfile *outfptr,long row,void *tiledata,long tilelen,long tilenx,long tileny,
              int nullcheck,void *nullflagval,int nullval,int zbitpix,double scale,double zero,
              int *intlength,int *flag,double *bscale,double *bzero,int *status)

{
  float fVar1;
  FITSfile *pFVar2;
  clock_t cVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  char *err_message;
  long lVar7;
  int *value;
  float fVar8;
  int imaxval;
  int iminval;
  time_t local_38;
  
  iminval = 0;
  imaxval = 0;
  if ((((zero != 0.0) || (NAN(zero))) || (scale != 1.0)) ||
     ((NAN(scale) || (zbitpix != 0x20 && (zbitpix & 0xffffffdfU) != 0xffffffc0)))) {
    err_message = "Implicit datatype conversion is not supported when writing to compressed images";
LAB_001c9309:
    ffpmsg(err_message);
    *status = 0x19d;
    return 0x19d;
  }
  *intlength = 4;
  pFVar2 = outfptr->Fptr;
  if (pFVar2->cn_zscale < 1) {
    fVar8 = pFVar2->quantize_level;
    if ((fVar8 != 9999.0) || (NAN(fVar8))) {
      imcomp_nullfloats((float *)tiledata,tilelen,(int *)tiledata,nullcheck,*nullflagval,nullval,
                        status);
    }
    else if ((((nullcheck == 1) && (fVar8 == 9999.0)) && (!NAN(fVar8))) && (0 < tilelen)) {
      fVar8 = *nullflagval;
      lVar7 = 0;
      do {
        fVar1 = *(float *)((long)tiledata + lVar7 * 4);
        if ((fVar1 == fVar8) && (!NAN(fVar1) && !NAN(fVar8))) {
          *(undefined4 *)((long)tiledata + lVar7 * 4) = 0xffffffff;
        }
        lVar7 = lVar7 + 1;
      } while (tilelen != lVar7);
    }
    goto LAB_001c9577;
  }
  if (nullcheck == 1) {
    fVar8 = *nullflagval;
  }
  else {
    fVar8 = -9.11912e-36;
  }
  if (pFVar2->quantize_method - 1U < 2) {
    if ((pFVar2->request_dither_seed == 0) && (pFVar2->dither_seed == 0)) {
      local_38 = time((time_t *)0x0);
      cVar3 = clock();
      pFVar2 = outfptr->Fptr;
      pFVar2->dither_seed = ((int)cVar3 / 10000 + (int)local_38 + pFVar2->curhdu) % 10000 + 1;
      value = &pFVar2->dither_seed;
LAB_001c94e3:
      ffuky(outfptr,0x1f,"ZDITHER0",value,(char *)0x0,status);
    }
    else if ((pFVar2->request_dither_seed < 0) && (pFVar2->dither_seed < 0)) {
      value = &pFVar2->dither_seed;
      if (tilelen < 1) {
        iVar4 = 1;
      }
      else {
        lVar7 = 1;
        if (1 < tilelen * 4) {
          lVar7 = tilelen * 4;
        }
        uVar5 = 0;
        lVar6 = 0;
        do {
          uVar5 = uVar5 + *(byte *)((long)tiledata + lVar6);
          lVar6 = lVar6 + 1;
        } while (lVar7 != lVar6);
        iVar4 = (int)uVar5 + (int)(uVar5 / 10000) * -10000 + 1;
      }
      *value = iVar4;
      goto LAB_001c94e3;
    }
    lVar7 = outfptr->Fptr->dither_seed + row + -1;
  }
  else {
    if (pFVar2->quantize_method != -1) {
      ffpmsg("Unknown dithering method.");
      err_message = "May need to install a newer version of CFITSIO.";
      goto LAB_001c9309;
    }
    lVar7 = 0;
  }
  iVar4 = fits_quantize_float(lVar7,(float *)tiledata,tilenx,tileny,nullcheck,fVar8,
                              outfptr->Fptr->quantize_level,outfptr->Fptr->quantize_method,
                              (int *)tiledata,bscale,bzero,&iminval,&imaxval);
  *flag = iVar4;
  if (1 < iVar4) {
    *status = iVar4;
    return iVar4;
  }
LAB_001c9577:
  return *status;
}

Assistant:

int imcomp_convert_tile_tfloat(
    fitsfile *outfptr,
    long row,
    void *tiledata, 
    long tilelen,
    long tilenx,
    long tileny,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *flag,
    double *bscale,
    double *bzero,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input float tile array in place to 4 or 8-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int *idata;
    long irow, ii;
    float floatnull;
    unsigned char *usbbuff;
    unsigned long dithersum;
    int iminval = 0, imaxval = 0;  /* min and max quantized integers */

        /* datatype of input array is double.  We only support writing this datatype
           to a FITS image with BITPIX = -64 or -32, except we also support the special case where
	   BITPIX = 32 and BZERO = 0 and BSCALE = 1.  */

       if ((zbitpix != LONG_IMG && zbitpix != DOUBLE_IMG && zbitpix != FLOAT_IMG) || scale != 1.0 || zero != 0.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

           *intlength = 4;
           idata = (int *) tiledata;

          /* if the tile-compressed table contains zscale and zzero columns */
          /* then scale and quantize the input floating point data.    */

          if ((outfptr->Fptr)->cn_zscale > 0) {
	    /* quantize the float values into integers */

            if (nullcheck == 1)
	      floatnull = *(float *) (nullflagval);
	    else
	      floatnull = FLOATNULLVALUE;  /* NaNs are represented by this, by default */

            if ((outfptr->Fptr)->quantize_method == SUBTRACTIVE_DITHER_1  ||
	        (outfptr->Fptr)->quantize_method == SUBTRACTIVE_DITHER_2) {
	      
	          /* see if the dithering offset value needs to be initialized */                  
	          if ((outfptr->Fptr)->request_dither_seed == 0 && (outfptr->Fptr)->dither_seed == 0) {

		     /* This means randomly choose the dithering offset based on the system time. */
		     /* The offset will have a value between 1 and 10000, inclusive. */
		     /* The time function returns an integer value that is incremented each second. */
		     /* The clock function returns the elapsed CPU time, in integer CLOCKS_PER_SEC units. */
		     /* The CPU time returned by clock is typically (on linux PC) only good to 0.01 sec */
		     /* Summing the 2 quantities may help avoid cases where 2 executions of the program */
		     /* (perhaps in a multithreaded environoment) end up with exactly the same dither seed */
		     /* value.  The sum is incremented by the current HDU number in the file to provide */
		     /* further randomization.  This randomization is desireable if multiple compressed */
		     /* images will be summed (or differenced). In such cases, the benefits of dithering */
		     /* may be lost if all the images use exactly the same sequence of random numbers when */
		     /* calculating the dithering offsets. */	     
		     
		     (outfptr->Fptr)->dither_seed = 
		       (( (int)time(NULL) + ( (int) clock() / (int) (CLOCKS_PER_SEC / 100)) + (outfptr->Fptr)->curhdu) % 10000) + 1;
		     
                     /* update the header keyword with this new value */
		     fits_update_key(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->dither_seed), 
	                        NULL, status);

	          } else if ((outfptr->Fptr)->request_dither_seed < 0 && (outfptr->Fptr)->dither_seed < 0) {

		     /* this means randomly choose the dithering offset based on some hash function */
		     /* of the first input tile of data to be quantized and compressed.  This ensures that */
                     /* the same offset value is used for a given image every time it is compressed. */

		     usbbuff = (unsigned char *) tiledata;
		     dithersum = 0;
		     for (ii = 0; ii < 4 * tilelen; ii++) {
		         dithersum += usbbuff[ii];  /* doesn't matter if there is an integer overflow */
	             }
		     (outfptr->Fptr)->dither_seed = ((int) (dithersum % 10000)) + 1;
		
                     /* update the header keyword with this new value */
		     fits_update_key(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->dither_seed), 
	                        NULL, status);
		  }

                  /* subtract 1 to convert from 1-based to 0-based element number */
	          irow = row + (outfptr->Fptr)->dither_seed - 1; /* dither the quantized values */

	      } else if ((outfptr->Fptr)->quantize_method == -1) {
	          irow = 0;  /* do not dither the quantized values */
              } else {
                  ffpmsg("Unknown dithering method.");
                  ffpmsg("May need to install a newer version of CFITSIO.");
                  return(*status = DATA_COMPRESSION_ERR);
              }

              *flag = fits_quantize_float (irow, (float *) tiledata, tilenx, tileny,
                   nullcheck, floatnull, (outfptr->Fptr)->quantize_level, 
		   (outfptr->Fptr)->quantize_method, idata, bscale, bzero, &iminval, &imaxval);

              if (*flag > 1)
		   return(*status = *flag);
          }
          else if ((outfptr->Fptr)->quantize_level != NO_QUANTIZE)
	  {
	    /* if floating point pixels are not being losslessly compressed, then */
	    /* input float data is implicitly converted (truncated) to integers */
            if ((scale != 1. || zero != 0.))  /* must scale the values */
	       imcomp_nullscalefloats((float *) tiledata, tilelen, idata, scale, zero,
	           nullcheck, *(float *) (nullflagval), nullval, status);
             else
	       imcomp_nullfloats((float *) tiledata, tilelen, idata,
	           nullcheck, *(float *) (nullflagval), nullval,  status);
          }
          else if ((outfptr->Fptr)->quantize_level == NO_QUANTIZE)
	  {
	      /* just convert null values to NaNs in place, if necessary, then do lossless gzip compression */
		if (nullcheck == 1) {
	            imcomp_float2nan((float *) tiledata, tilelen, (int *) tiledata,
	                *(float *) (nullflagval), status);
		}
          }

          return(*status);
}